

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void help(void)

{
  fprintf(_stderr,
          "-P process_id\n-d path for concatenation\n-u do not sort by event/period ID\n-h help\n-v version\n"
         );
  return;
}

Assistant:

void help()
{
	fprintf(stderr,
		"-P process_id\n"
		"-d path for concatenation\n"
		"-u do not sort by event/period ID\n"
		"-h help\n"
		"-v version\n"
	);
}